

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_xpath(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  xmlXPathObjectPtr pxVar38;
  xmlNodePtr pxVar39;
  undefined8 uVar40;
  xmlNodePtr pxVar41;
  xmlDocPtr pxVar42;
  undefined4 uVar43;
  int nr;
  int extraout_EDX;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int n_val;
  uint uVar44;
  xmlNodePtr in_RSI;
  ulong uVar45;
  undefined4 uVar46;
  int test_ret;
  int iVar47;
  uint uVar48;
  int test_ret_5;
  undefined4 *puVar49;
  ulong uVar50;
  int test_ret_1;
  int test_ret_2;
  int iVar51;
  undefined8 *puVar52;
  undefined1 auVar53 [12];
  int test_ret_4;
  int test_ret_10;
  int test_ret_20;
  uint local_48;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing xpath : 32 of 41 functions ...");
  }
  puVar49 = &DAT_00157174;
  uVar44 = 0;
  iVar47 = 0;
  do {
    iVar1 = xmlMemBlocks();
    uVar46 = 0xffffffff;
    if (uVar44 < 4) {
      uVar46 = *puVar49;
    }
    xmlXPathCastBooleanToNumber(uVar46);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastBooleanToNumber",(ulong)(uint)(iVar2 - iVar1));
      iVar47 = iVar47 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  puVar49 = &DAT_00157174;
  uVar44 = 0;
  iVar1 = 0;
  do {
    iVar2 = xmlMemBlocks();
    uVar46 = 0xffffffff;
    if (uVar44 < 4) {
      uVar46 = *puVar49;
    }
    lVar37 = xmlXPathCastBooleanToString(uVar46);
    if (lVar37 != 0) {
      (*_xmlFree)(lVar37);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastBooleanToString",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlXPathCastNodeSetToBoolean(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToBoolean");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlXPathCastNodeSetToNumber(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToNumber");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar37 = xmlXPathCastNodeSetToString(0);
  if (lVar37 != 0) {
    (*_xmlFree)(lVar37);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToString");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar51 = 0;
  do {
    iVar9 = (int)in_RSI;
    iVar8 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar44,iVar9);
    xmlXPathCastNodeToNumber(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar44,in_RSI,nr);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNodeToNumber",(ulong)(uint)(iVar9 - iVar8));
      iVar51 = iVar51 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar8 = 0;
  do {
    iVar9 = (int)in_RSI;
    iVar10 = xmlMemBlocks();
    in_RSI = gen_xmlNodePtr(uVar44,iVar9);
    auVar53 = xmlXPathCastNodeToString(in_RSI);
    iVar9 = auVar53._8_4_;
    if (auVar53._0_8_ != 0) {
      (*_xmlFree)(auVar53._0_8_);
      iVar9 = extraout_EDX;
    }
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar44,in_RSI,iVar9);
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar10 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNodeToString",(ulong)(uint)(iVar9 - iVar10));
      iVar8 = iVar8 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  local_48 = (uint)(iVar6 != iVar7);
  uVar44 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar44 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar44 != 2) {
        if (uVar44 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathCastNumberToBoolean(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar7 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNumberToBoolean",(ulong)(uint)(iVar9 - iVar7));
      iVar6 = iVar6 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar7 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar44 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar44 != 2) {
        if (uVar44 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    lVar37 = xmlXPathCastNumberToString(uVar40);
    if (lVar37 != 0) {
      (*_xmlFree)(lVar37);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNumberToString",(ulong)(uint)(iVar10 - iVar9));
      iVar7 = iVar7 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  puVar52 = &DAT_00159d60;
  uVar44 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar40 = *puVar52;
    }
    else {
      uVar40 = 0;
    }
    xmlXPathCastStringToBoolean(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastStringToBoolean",(ulong)(uint)(iVar11 - iVar10)
            );
      iVar9 = iVar9 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar52 = puVar52 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  puVar52 = &DAT_00159d60;
  uVar44 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar40 = *puVar52;
    }
    else {
      uVar40 = 0;
    }
    xmlXPathCastStringToNumber(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastStringToNumber",(ulong)(uint)(iVar12 - iVar11))
      ;
      iVar10 = iVar10 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar52 = puVar52 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar44,(int)in_RSI);
    xmlXPathCastToBoolean(pxVar38);
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToBoolean",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar44,(int)in_RSI);
    xmlXPathCastToNumber(pxVar38);
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToNumber",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar44,(int)in_RSI);
    lVar37 = xmlXPathCastToString(pxVar38);
    if (lVar37 != 0) {
      (*_xmlFree)(lVar37);
    }
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToString",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar44 = 0;
  do {
    uVar48 = 0;
    do {
      iVar16 = (int)in_RSI;
      iVar15 = xmlMemBlocks();
      pxVar39 = gen_xmlNodePtr(uVar44,iVar16);
      in_RSI = gen_xmlNodePtr(uVar48,iVar16);
      xmlXPathCmpNodes(pxVar39,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar44,pxVar39,nr_00);
      des_xmlNodePtr(uVar48,in_RSI,nr_01);
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar15 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathCmpNodes",(ulong)(uint)(iVar16 - iVar15));
        iVar14 = iVar14 + 1;
        printf(" %d",(ulong)uVar44);
        in_RSI = (xmlNodePtr)(ulong)uVar48;
        printf(" %d");
        putchar(10);
      }
      uVar48 = uVar48 + 1;
    } while (uVar48 != 3);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  uVar40 = xmlXPathCompiledEval(0,0);
  xmlXPathFreeObject(uVar40);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCompiledEval",(ulong)(uint)(iVar17 - iVar15));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = xmlMemBlocks();
  xmlXPathCompiledEvalToBoolean(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar18 = xmlMemBlocks();
  if (iVar17 != iVar18) {
    iVar19 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlXPathCompiledEvalToBoolean",(ulong)(uint)(iVar19 - iVar17)
          );
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar19 = 0;
  uVar44 = 0;
  do {
    uVar50 = 0;
    do {
      uVar48 = 0;
      puVar49 = &DAT_00157174;
      do {
        iVar20 = xmlMemBlocks();
        uVar46 = 0xffffffff;
        uVar45 = 0xffffffff;
        if (uVar44 < 4) {
          uVar45 = (ulong)(uint)(&DAT_00157174)[uVar44];
        }
        if ((uint)uVar50 < 4) {
          uVar46 = (&DAT_00157174)[uVar50];
        }
        uVar43 = 0xffffffff;
        if (uVar48 < 4) {
          uVar43 = *puVar49;
        }
        xmlXPathContextSetCache(0,uVar45,uVar46,uVar43);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar21 = xmlMemBlocks();
        if (iVar20 != iVar21) {
          iVar21 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlXPathContextSetCache",(ulong)(uint)(iVar21 - iVar20)
                );
          iVar19 = iVar19 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar44);
          printf(" %d",uVar50);
          uVar45 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
        puVar49 = puVar49 + 1;
      } while (uVar48 != 4);
      uVar48 = (uint)uVar50 + 1;
      uVar50 = (ulong)uVar48;
    } while (uVar48 != 4);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar20 = 0;
  do {
    iVar21 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar44,(int)uVar45);
    uVar40 = xmlXPathConvertBoolean(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar22 = xmlMemBlocks();
    if (iVar21 != iVar22) {
      iVar22 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConvertBoolean",(ulong)(uint)(iVar22 - iVar21));
      iVar20 = iVar20 + 1;
      uVar45 = (ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar44,(int)uVar45);
    uVar40 = xmlXPathConvertNumber(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConvertNumber",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      uVar45 = (ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar22 = 0;
  do {
    iVar23 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar44,(int)uVar45);
    uVar40 = xmlXPathConvertString(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathConvertString",(ulong)(uint)(iVar24 - iVar23));
      iVar22 = iVar22 + 1;
      uVar45 = (ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  puVar52 = &DAT_00159d60;
  iVar23 = 0;
  uVar44 = 0;
  do {
    iVar24 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar40 = *puVar52;
    }
    else {
      uVar40 = 0;
    }
    xmlXPathEval(uVar40);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar25 = xmlMemBlocks();
    if (iVar24 != iVar25) {
      iVar25 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEval",(ulong)(uint)(iVar25 - iVar24));
      iVar23 = iVar23 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar52 = puVar52 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  puVar52 = &DAT_00159d60;
  iVar24 = 0;
  uVar44 = 0;
  do {
    iVar25 = xmlMemBlocks();
    if (uVar44 < 4) {
      uVar40 = *puVar52;
    }
    else {
      uVar40 = 0;
    }
    pxVar39 = (xmlNodePtr)0x0;
    xmlXPathEvalExpression(uVar40);
    xmlXPathFreeObject();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar26 = xmlMemBlocks();
    if (iVar25 != iVar26) {
      iVar26 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEvalExpression",(ulong)(uint)(iVar26 - iVar25));
      iVar24 = iVar24 + 1;
      printf(" %d");
      pxVar39 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
    puVar52 = puVar52 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar25 = 0;
  do {
    iVar27 = (int)pxVar39;
    iVar26 = xmlMemBlocks();
    pxVar41 = (xmlNodePtr)gen_xmlXPathObjectPtr(uVar44,iVar27);
    pxVar39 = pxVar41;
    xmlXPathEvalPredicate(0);
    call_tests = call_tests + 1;
    if (pxVar41 != (xmlNodePtr)0x0) {
      xmlXPathFreeObject(pxVar41);
    }
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathEvalPredicate",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      printf(" %d",0);
      pxVar39 = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  iVar26 = xmlMemBlocks();
  xmlXPathInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar27 = xmlMemBlocks();
  if (iVar26 != iVar27) {
    iVar28 = xmlMemBlocks();
    pxVar39 = (xmlNodePtr)(ulong)(uint)(iVar28 - iVar26);
    printf("Leak of %d blocks found in xmlXPathInit");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar28 = 0;
  do {
    iVar29 = xmlMemBlocks();
    if (uVar44 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar44 != 2) {
        if (uVar44 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathIsInf(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar29 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIsInf",(ulong)(uint)(iVar30 - iVar29));
      iVar28 = iVar28 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  uVar44 = 0;
  local_34 = 0;
  do {
    iVar29 = xmlMemBlocks();
    if (uVar44 == 0) {
      uVar40 = 0;
    }
    else {
      uVar40 = _xmlXPathNAN;
      if (uVar44 != 2) {
        if (uVar44 == 1) {
          uVar40 = 0xbff199999999999a;
        }
        else {
          uVar40 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathIsNaN(uVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar29 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathIsNaN",(ulong)(uint)(iVar30 - iVar29));
      local_34 = local_34 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar29 = 0;
  uVar44 = 0;
  do {
    puVar52 = &DAT_00159d60;
    uVar48 = 0;
    do {
      iVar31 = (int)pxVar39;
      iVar30 = xmlMemBlocks();
      pxVar39 = gen_xmlNodePtr(uVar44,iVar31);
      if (uVar48 < 4) {
        uVar40 = *puVar52;
      }
      else {
        uVar40 = 0;
      }
      uVar40 = xmlXPathNodeEval(pxVar39,uVar40,0);
      xmlXPathFreeObject(uVar40);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar44,pxVar39,nr_02);
      xmlResetLastError();
      iVar31 = xmlMemBlocks();
      if (iVar30 != iVar31) {
        iVar31 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeEval",(ulong)(uint)(iVar31 - iVar30));
        iVar29 = iVar29 + 1;
        printf(" %d",(ulong)uVar44);
        printf(" %d");
        pxVar39 = (xmlNodePtr)0x0;
        printf(" %d");
        putchar(10);
      }
      uVar48 = uVar48 + 1;
      puVar52 = puVar52 + 1;
    } while (uVar48 != 5);
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar30 = 0;
  do {
    iVar32 = (int)pxVar39;
    iVar31 = xmlMemBlocks();
    pxVar39 = gen_xmlNodePtr(uVar44,iVar32);
    uVar40 = xmlXPathNodeSetCreate(pxVar39);
    xmlXPathFreeNodeSet(uVar40);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar44,pxVar39,nr_03);
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathNodeSetCreate",(ulong)(uint)(iVar32 - iVar31));
      iVar30 = iVar30 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 3);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar31 = 0;
  do {
    iVar32 = xmlMemBlocks();
    pxVar38 = gen_xmlXPathObjectPtr(uVar44,(int)pxVar39);
    uVar40 = xmlXPathObjectCopy(pxVar38);
    xmlXPathFreeObject(uVar40);
    call_tests = call_tests + 1;
    if (pxVar38 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject(pxVar38);
    }
    xmlResetLastError();
    iVar33 = xmlMemBlocks();
    if (iVar32 != iVar33) {
      iVar33 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathObjectCopy",(ulong)(uint)(iVar33 - iVar32));
      iVar31 = iVar31 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 5);
  function_tests = function_tests + 1;
  uVar44 = 0;
  iVar32 = 0;
  do {
    iVar33 = xmlMemBlocks();
    pxVar42 = gen_xmlDocPtr(uVar44,(int)pxVar39);
    xmlXPathOrderDocElems(pxVar42);
    call_tests = call_tests + 1;
    if (((pxVar42 != (xmlDocPtr)0x0) && (api_doc != pxVar42)) && (pxVar42->doc != api_doc)) {
      xmlFreeDoc(pxVar42);
    }
    xmlResetLastError();
    iVar34 = xmlMemBlocks();
    if (iVar33 != iVar34) {
      iVar34 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathOrderDocElems",(ulong)(uint)(iVar34 - iVar33));
      iVar32 = iVar32 + 1;
      pxVar39 = (xmlNodePtr)(ulong)uVar44;
      printf(" %d");
      putchar(10);
    }
    uVar44 = uVar44 + 1;
  } while (uVar44 != 4);
  function_tests = function_tests + 1;
  iVar34 = 0;
  iVar33 = 0;
  do {
    iVar36 = (int)pxVar39;
    iVar35 = xmlMemBlocks();
    pxVar39 = gen_xmlNodePtr(iVar33,iVar36);
    xmlXPathSetContextNode(pxVar39,0);
    call_tests = call_tests + 1;
    des_xmlNodePtr(iVar33,pxVar39,nr_04);
    xmlResetLastError();
    iVar36 = xmlMemBlocks();
    if (iVar35 != iVar36) {
      iVar36 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathSetContextNode",(ulong)(uint)(iVar36 - iVar35));
      iVar34 = iVar34 + 1;
      printf(" %d");
      pxVar39 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar33 = iVar33 + 1;
  } while (iVar33 != 3);
  function_tests = function_tests + 1;
  uVar44 = iVar1 + iVar47 + (uint)(iVar2 != iVar3) + (uint)(iVar4 != iVar5) + local_48 + iVar51 +
           iVar8 + iVar6 + iVar7 + iVar9 + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 +
           (uint)(iVar15 != iVar16) + (uint)(iVar17 != iVar18) + iVar19 + iVar20 + iVar21 + iVar22 +
           iVar23 + iVar24 + iVar25 + (uint)(iVar26 != iVar27) + iVar28 + local_34 + iVar29 + iVar30
           + iVar31 + iVar32 + iVar34;
  if (uVar44 != 0) {
    printf("Module xpath: %d errors\n",(ulong)uVar44);
  }
  return uVar44;
}

Assistant:

static int
test_xpath(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpath : 32 of 41 functions ...\n");
    test_ret += test_xmlXPathCastBooleanToNumber();
    test_ret += test_xmlXPathCastBooleanToString();
    test_ret += test_xmlXPathCastNodeSetToBoolean();
    test_ret += test_xmlXPathCastNodeSetToNumber();
    test_ret += test_xmlXPathCastNodeSetToString();
    test_ret += test_xmlXPathCastNodeToNumber();
    test_ret += test_xmlXPathCastNodeToString();
    test_ret += test_xmlXPathCastNumberToBoolean();
    test_ret += test_xmlXPathCastNumberToString();
    test_ret += test_xmlXPathCastStringToBoolean();
    test_ret += test_xmlXPathCastStringToNumber();
    test_ret += test_xmlXPathCastToBoolean();
    test_ret += test_xmlXPathCastToNumber();
    test_ret += test_xmlXPathCastToString();
    test_ret += test_xmlXPathCmpNodes();
    test_ret += test_xmlXPathCompile();
    test_ret += test_xmlXPathCompiledEval();
    test_ret += test_xmlXPathCompiledEvalToBoolean();
    test_ret += test_xmlXPathContextSetCache();
    test_ret += test_xmlXPathConvertBoolean();
    test_ret += test_xmlXPathConvertNumber();
    test_ret += test_xmlXPathConvertString();
    test_ret += test_xmlXPathCtxtCompile();
    test_ret += test_xmlXPathEval();
    test_ret += test_xmlXPathEvalExpression();
    test_ret += test_xmlXPathEvalPredicate();
    test_ret += test_xmlXPathInit();
    test_ret += test_xmlXPathIsInf();
    test_ret += test_xmlXPathIsNaN();
    test_ret += test_xmlXPathNewContext();
    test_ret += test_xmlXPathNodeEval();
    test_ret += test_xmlXPathNodeSetCreate();
    test_ret += test_xmlXPathObjectCopy();
    test_ret += test_xmlXPathOrderDocElems();
    test_ret += test_xmlXPathSetContextNode();
    test_ret += test_xmlXPathSetErrorHandler();

    if (test_ret != 0)
	printf("Module xpath: %d errors\n", test_ret);
    return(test_ret);
}